

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O1

void __thiscall
SignParameter_DefaultConstructorTest_Test::TestBody(SignParameter_DefaultConstructorTest_Test *this)

{
  SignParameter sign_parameter;
  ByteData *in_stack_ffffffffffffff20;
  Pubkey local_d8;
  undefined1 local_c0 [40];
  pointer local_98 [3];
  SignParameter local_80;
  
  cfd::SignParameter::SignParameter(&local_80);
  cfd::core::ByteData::ByteData((ByteData *)local_c0);
  cfd::core::Pubkey::Pubkey(&local_d8);
  cfd::core::SigHashType::SigHashType((SigHashType *)(local_c0 + 0x1c));
  cfd::core::ByteData::ByteData((ByteData *)local_98);
  anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&local_80,(SignParameter *)local_c0,(ByteData *)0x1,
             (SignDataType)&local_d8,(Pubkey *)0x0,(bool)((char)local_c0 + '\x1c'),
             (SigHashType *)local_98,in_stack_ffffffffffffff20);
  if (local_98[0] != (pointer)0x0) {
    operator_delete(local_98[0]);
  }
  if (local_d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_c0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_c0._0_8_);
  }
  local_80.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.op_code_.text_data_._M_dataplus._M_p != &local_80.op_code_.text_data_.field_2) {
    operator_delete(local_80.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_80.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SignParameter, DefaultConstructorTest)
{
  // default constructor
  SignParameter sign_parameter = SignParameter();
  CompareSignparameter(sign_parameter, ByteData(), SignDataType::kBinary,
      Pubkey(), false, SigHashType(), ByteData());
}